

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

int Ptr_ManCountNtk(Vec_Ptr_t *vNtk)

{
  void **ppvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = vNtk->nSize;
  if ((((1 < iVar2) && (iVar2 != 2)) && (3 < iVar2)) && (iVar2 != 4)) {
    ppvVar1 = vNtk->pArray;
    if (*(int *)((long)ppvVar1[3] + 4) == 0) {
      iVar2 = *(int *)((long)ppvVar1[2] + 4) + *(int *)((long)ppvVar1[1] + 4);
      lVar3 = (long)*(int *)((long)ppvVar1[4] + 4);
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          iVar2 = iVar2 + *(int *)(*(long *)(*(long *)((long)ppvVar1[4] + 8) + lVar4 * 8) + 4) / 2;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      return iVar2;
    }
    __assert_fail("Vec_PtrSize(vNodes) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x106,"int Ptr_ManCountNtk(Vec_Ptr_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Ptr_ManCountNtk( Vec_Ptr_t * vNtk )
{
    Vec_Ptr_t * vInputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vNodes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 3);
    Vec_Ptr_t * vBoxes = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vBox; int i, Counter = 0;
    assert( Vec_PtrSize(vNodes) == 0 );
    Counter += Vec_PtrSize(vInputs);
    Counter += Vec_PtrSize(vOutputs);
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
        Counter += Vec_PtrSize(vBox)/2;
    return Counter;
}